

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall
QPDF::writeJSON(QPDF *this,int version,Pipeline *p,bool complete,bool *first_key,
               qpdf_stream_decode_level_e decode_level,qpdf_json_stream_data_e json_stream_data,
               string *file_prefix,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               wanted_objects)

{
  long lVar1;
  bool bVar2;
  Writer *pWVar3;
  size_t __val;
  size_type sVar4;
  runtime_error *this_00;
  undefined7 in_register_00000009;
  char *pcVar5;
  char *s;
  pointer this_01;
  allocator<char> local_f1;
  QPDF *local_f0;
  qpdf_stream_decode_level_e local_e8;
  undefined4 local_e4;
  string key;
  Writer jw;
  QPDFObjGen og;
  Stream stream;
  string local_68;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_48;
  
  local_f0 = this;
  local_e8 = decode_level;
  if (version != 2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"QPDF::writeJSON: only version 2 is supported");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  jw.first = true;
  jw.indent = 8;
  local_e4 = (undefined4)CONCAT71(in_register_00000009,complete);
  jw.p = p;
  if (complete) {
    pcVar5 = "{";
LAB_001d19f3:
    JSON::Writer::operator<<(&jw,pcVar5);
  }
  else if (*first_key == false) {
    pcVar5 = ",";
    goto LAB_001d19f3;
  }
  *first_key = false;
  pWVar3 = JSON::Writer::operator<<(&jw,"\n  \"qpdf\": [\n    {\n      \"jsonversion\": ");
  std::__cxx11::to_string(&key,2);
  (*pWVar3->p->_vptr_Pipeline[2])(pWVar3->p,key._M_dataplus._M_p,key._M_string_length);
  pWVar3 = JSON::Writer::operator<<(pWVar3,",\n      \"pdfversion\": \"");
  getPDFVersion_abi_cxx11_(&local_68,local_f0);
  (*pWVar3->p->_vptr_Pipeline[2])(pWVar3->p,local_68._M_dataplus._M_p,local_68._M_string_length);
  pWVar3 = JSON::Writer::operator<<(pWVar3,"\",\n      \"pushedinheritedpageresources\": ");
  bVar2 = everPushedInheritedAttributesToPages(local_f0);
  pcVar5 = "false";
  s = "false";
  if (bVar2) {
    s = "true";
  }
  pWVar3 = JSON::Writer::operator<<(pWVar3,s);
  pWVar3 = JSON::Writer::operator<<(pWVar3,",\n      \"calledgetallpages\": ");
  bVar2 = everCalledGetAllPages(local_f0);
  if (bVar2) {
    pcVar5 = "true";
  }
  pWVar3 = JSON::Writer::operator<<(pWVar3,pcVar5);
  pWVar3 = JSON::Writer::operator<<(pWVar3,",\n      \"maxobjectid\": ");
  __val = getObjectCount(local_f0);
  std::__cxx11::to_string((string *)&stream,__val);
  (*pWVar3->p->_vptr_Pipeline[2])
            (pWVar3->p,
             stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,stream.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  JSON::Writer::operator<<(pWVar3,"\n    },\n    {");
  std::__cxx11::string::~string((string *)&stream);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&key);
  lVar1 = *(long *)(wanted_objects._M_t._M_impl._0_8_ + 0x28);
  getAllObjects(&local_48,local_f0);
  bVar2 = true;
  for (this_01 = local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      this_01 !=
      local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    og = QPDFObjectHandle::getObjGen(this_01);
    QPDFObjGen::unparse_abi_cxx11_((string *)&stream,&og,' ');
    std::operator+(&local_68,"obj:",(string *)&stream);
    std::operator+(&key,&local_68," R");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&stream);
    if ((lVar1 == 0) ||
       (sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)wanted_objects._M_t._M_impl._0_8_,&key), sVar4 != 0)) {
      if (bVar2) {
        pWVar3 = JSON::Writer::operator<<(&jw,"\n      \"");
        (*pWVar3->p->_vptr_Pipeline[2])(pWVar3->p,key._M_dataplus._M_p,key._M_string_length);
        bVar2 = false;
      }
      else {
        pWVar3 = JSON::Writer::operator<<(&jw,"\n      },\n      \"");
        (*pWVar3->p->_vptr_Pipeline[2])(pWVar3->p,key._M_dataplus._M_p,key._M_string_length);
      }
      QPDFObjectHandle::as_stream((QPDFObjectHandle *)&stream,(typed)this_01);
      if (stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        JSON::Writer::operator<<(&jw,"\": {\n        \"value\": ");
        QPDFObjectHandle::writeJSON(this_01,2,&jw,true);
      }
      else {
        JSON::Writer::operator<<(&jw,"\": {\n        \"stream\": ");
        if (json_stream_data == qpdf_sj_file) {
          writeJSONStreamFile(2,&jw,&stream,og.obj,local_e8,file_prefix);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_f1);
          ::qpdf::Stream::writeStreamJSON
                    (&stream,2,&jw,json_stream_data,local_e8,(Pipeline *)0x0,&local_68,false);
          std::__cxx11::string::~string((string *)&local_68);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&stream.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__cxx11::string::~string((string *)&key);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_48);
  if (lVar1 == 0) {
LAB_001d1d73:
    if (!bVar2) {
      JSON::Writer::operator<<(&jw,"\n      },");
    }
    JSON::Writer::operator<<(&jw,"\n      \"trailer\": {\n        \"value\": ");
    getTrailer((QPDF *)&key);
    QPDFObjectHandle::writeJSON((QPDFObjectHandle *)&key,2,&jw,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&key._M_string_length);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&key,"trailer",(allocator<char> *)&local_68);
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)wanted_objects._M_t._M_impl._0_8_,&key);
    std::__cxx11::string::~string((string *)&key);
    if (sVar4 != 0) goto LAB_001d1d73;
    if (bVar2) goto LAB_001d1ddb;
  }
  JSON::Writer::operator<<(&jw,"\n      }");
LAB_001d1ddb:
  JSON::Writer::operator<<(&jw,"\n    }\n  ]");
  if ((char)local_e4 != '\0') {
    JSON::Writer::operator<<(&jw,"\n}\n");
    (*p->_vptr_Pipeline[3])();
  }
  return;
}

Assistant:

void
QPDF::writeJSON(
    int version,
    Pipeline* p,
    bool complete,
    bool& first_key,
    qpdf_stream_decode_level_e decode_level,
    qpdf_json_stream_data_e json_stream_data,
    std::string const& file_prefix,
    std::set<std::string> wanted_objects)
{
    if (version != 2) {
        throw std::runtime_error("QPDF::writeJSON: only version 2 is supported");
    }
    JSON::Writer jw{p, 4};
    if (complete) {
        jw << "{";
    } else if (!first_key) {
        jw << ",";
    }
    first_key = false;

    /* clang-format off */
    jw << "\n"
          "  \"qpdf\": [\n"
          "    {\n"
          "      \"jsonversion\": " << std::to_string(version) << ",\n"
          "      \"pdfversion\": \"" << getPDFVersion() << "\",\n"
          "      \"pushedinheritedpageresources\": " <<  (everPushedInheritedAttributesToPages() ? "true" : "false") << ",\n"
          "      \"calledgetallpages\": " <<  (everCalledGetAllPages() ? "true" : "false") << ",\n"
          "      \"maxobjectid\": " <<  std::to_string(getObjectCount()) << "\n"
          "    },\n"
          "    {";
    /* clang-format on */

    bool all_objects = wanted_objects.empty();
    bool first = true;
    for (auto& obj: getAllObjects()) {
        auto const og = obj.getObjGen();
        std::string key = "obj:" + og.unparse(' ') + " R";
        if (all_objects || wanted_objects.count(key)) {
            if (first) {
                jw << "\n      \"" << key;
                first = false;
            } else {
                jw << "\n      },\n      \"" << key;
            }
            if (auto stream = obj.as_stream()) {
                jw << "\": {\n        \"stream\": ";
                if (json_stream_data == qpdf_sj_file) {
                    writeJSONStreamFile(
                        version, jw, stream, og.getObj(), decode_level, file_prefix);
                } else {
                    stream.writeStreamJSON(
                        version, jw, json_stream_data, decode_level, nullptr, "");
                }
            } else {
                jw << "\": {\n        \"value\": ";
                obj.writeJSON(version, jw, true);
            }
        }
    }
    if (all_objects || wanted_objects.count("trailer")) {
        if (!first) {
            jw << "\n      },";
        }
        jw << "\n      \"trailer\": {\n        \"value\": ";
        getTrailer().writeJSON(version, jw, true);
        first = false;
    }
    if (!first) {
        jw << "\n      }";
    }
    /* clang-format off */
    jw << "\n"
          "    }\n"
          "  ]";
    /* clang-format on */
    if (complete) {
        jw << "\n}\n";
        p->finish();
    }
}